

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Builder::AddTarget(Builder *this,Node *node,string *err)

{
  bool bVar1;
  
  bVar1 = DependencyScan::RecomputeDirty(&this->scan_,node,err);
  if (bVar1) {
    if ((node->in_edge_ == (Edge *)0x0) || (bVar1 = true, node->in_edge_->outputs_ready_ == false))
    {
      bVar1 = Plan::AddSubTarget(&this->plan_,node,(Node *)0x0,err,
                                 (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0);
      return bVar1;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Builder::AddTarget(Node* node, string* err) {
  if (!scan_.RecomputeDirty(node, err))
    return false;

  if (Edge* in_edge = node->in_edge()) {
    if (in_edge->outputs_ready())
      return true;  // Nothing to do.
  }

  if (!plan_.AddTarget(node, err))
    return false;

  return true;
}